

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::initiateIdleShutdown(ConnectionImpl *this)

{
  PromiseFulfiller<void> *pPVar1;
  IncomingRpcMessage *pIVar2;
  undefined1 local_19;
  Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_> local_18;
  
  this->initiatedIdleShutdown = true;
  local_18.ptr.disposer = (Disposer *)0x0;
  local_18.ptr.ptr = (IncomingRpcMessage *)0x0;
  kj::ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::push
            (&this->messageQueue,&local_18);
  pIVar2 = local_18.ptr.ptr;
  if (local_18.ptr.ptr != (IncomingRpcMessage *)0x0) {
    local_18.ptr.ptr = (IncomingRpcMessage *)0x0;
    (**(local_18.ptr.disposer)->_vptr_Disposer)
              (local_18.ptr.disposer,
               pIVar2->_vptr_IncomingRpcMessage[-2] + (long)&pIVar2->_vptr_IncomingRpcMessage);
  }
  pPVar1 = (this->fulfillOnEnd).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (*(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar1,&local_19);
  }
  return;
}

Assistant:

void initiateIdleShutdown() {
      initiatedIdleShutdown = true;
      messageQueue.push(kj::none);
      KJ_IF_SOME(f, fulfillOnEnd) {
        f->fulfill();
      }
    }